

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseExpectedValues(WastParser *this,ExpectationPtr *expectation)

{
  bool bVar1;
  Result result;
  pointer pEVar2;
  pointer pVVar3;
  undefined1 local_58 [8];
  __single_object values;
  undefined1 local_48 [8];
  __single_object either;
  Location loc;
  ExpectationPtr *expectation_local;
  WastParser *this_local;
  
  GetLocation((Location *)&either,this);
  bVar1 = PeekMatchLpar(this,Either);
  if (bVar1) {
    std::make_unique<wabt::EitherExpectation,wabt::Location&>((Location *)local_48);
    pEVar2 = std::unique_ptr<wabt::EitherExpectation,_std::default_delete<wabt::EitherExpectation>_>
             ::operator->((unique_ptr<wabt::EitherExpectation,_std::default_delete<wabt::EitherExpectation>_>
                           *)local_48);
    values._M_t.
    super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>._M_t
    .super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>.
    super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl._4_4_ =
         ParseEither(this,&(pEVar2->super_ExpectationMixin<(wabt::ExpectationType)1>).
                           super_Expectation.expected);
    bVar1 = Failed(values._M_t.
                   super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>
                   .super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::unique_ptr<wabt::Expectation,std::default_delete<wabt::Expectation>>::operator=
                ((unique_ptr<wabt::Expectation,std::default_delete<wabt::Expectation>> *)expectation
                 ,(unique_ptr<wabt::EitherExpectation,_std::default_delete<wabt::EitherExpectation>_>
                   *)local_48);
    }
    values._M_t.
    super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>._M_t
    .super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>.
    super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl._1_3_ = 0;
    values._M_t.
    super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>._M_t
    .super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>.
    super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl._0_1_ = bVar1;
    std::unique_ptr<wabt::EitherExpectation,_std::default_delete<wabt::EitherExpectation>_>::
    ~unique_ptr((unique_ptr<wabt::EitherExpectation,_std::default_delete<wabt::EitherExpectation>_>
                 *)local_48);
  }
  else {
    std::make_unique<wabt::ValueExpectation,wabt::Location&>((Location *)local_58);
    pVVar3 = std::unique_ptr<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>::
             operator->((unique_ptr<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>
                         *)local_58);
    result = ParseConstList(this,&(pVVar3->super_ExpectationMixin<(wabt::ExpectationType)0>).
                                  super_Expectation.expected,Expectation);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::unique_ptr<wabt::Expectation,std::default_delete<wabt::Expectation>>::operator=
                ((unique_ptr<wabt::Expectation,std::default_delete<wabt::Expectation>> *)expectation
                 ,(unique_ptr<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>
                   *)local_58);
    }
    values._M_t.
    super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>._M_t
    .super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>.
    super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl._1_3_ = 0;
    values._M_t.
    super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>._M_t
    .super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>.
    super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl._0_1_ = bVar1;
    std::unique_ptr<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>::
    ~unique_ptr((unique_ptr<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_> *)
                local_58);
  }
  if ((uint)values._M_t.
            super___uniq_ptr_impl<wabt::ValueExpectation,_std::default_delete<wabt::ValueExpectation>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::ValueExpectation_*,_std::default_delete<wabt::ValueExpectation>_>
            .super__Head_base<0UL,_wabt::ValueExpectation_*,_false>._M_head_impl == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExpectedValues(ExpectationPtr* expectation) {
  WABT_TRACE(ParseExpectedValues);
  Location loc = GetLocation();
  if (PeekMatchLpar(TokenType::Either)) {
    auto either = std::make_unique<EitherExpectation>(loc);
    CHECK_RESULT(ParseEither(&either->expected));
    *expectation = std::move(either);
  } else {
    auto values = std::make_unique<ValueExpectation>(loc);
    CHECK_RESULT(ParseConstList(&values->expected, ConstType::Expectation));
    *expectation = std::move(values);
  }
  return Result::Ok;
}